

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-crit.cpp
# Opt level: O2

bool usesTheVariable(Instruction *I,string *var,bool isglobal,LLVMPointerAnalysis *pta)

{
  ConstantExpr CVar1;
  bool bVar2;
  bool bVar3;
  raw_ostream *prVar4;
  Value *CE;
  const_iterator __begin1;
  pair<bool,_dg::LLVMMemoryRegionSet> memacc;
  const_iterator local_70;
  Instruction local_60 [8];
  _Rb_tree<llvm::Value_*,_std::pair<llvm::Value_*const,_std::vector<dg::LLVMMemoryRegionSet::OffsetPair,_std::allocator<dg::LLVMMemoryRegionSet::OffsetPair>_>_>,_std::_Select1st<std::pair<llvm::Value_*const,_std::vector<dg::LLVMMemoryRegionSet::OffsetPair,_std::allocator<dg::LLVMMemoryRegionSet::OffsetPair>_>_>_>,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_std::vector<dg::LLVMMemoryRegionSet::OffsetPair,_std::allocator<dg::LLVMMemoryRegionSet::OffsetPair>_>_>_>_>
  local_58 [8];
  _Rb_tree_node_base local_50;
  
  bVar2 = llvm::Instruction::mayReadOrWriteMemory(I);
  if (bVar2) {
    if (pta != (LLVMPointerAnalysis *)0x0) {
      dg::LLVMPointerAnalysis::getAccessedMemory(local_60);
      if (local_60[0] == (Instruction)0x1) {
        prVar4 = (raw_ostream *)llvm::errs();
        prVar4 = llvm::raw_ostream::operator<<
                           (prVar4,"WARNING: matched due to a lack of information: ");
        prVar4 = llvm::operator<<(prVar4,(Value *)I);
        llvm::raw_ostream::operator<<(prVar4,"\n");
        bVar2 = true;
      }
      else {
        local_70.pos = 0;
        local_70.it._M_node = local_50._M_left;
        while ((bVar2 = local_70.it._M_node != &local_50 || local_70.pos != 0,
               local_70.it._M_node != &local_50 || local_70.pos != 0 &&
               (((isglobal && ((*(Value **)(local_70.it._M_node + 1))[0x10] != (Value)0x3)) ||
                (bVar3 = mayBeTheVar(*(Value **)(local_70.it._M_node + 1),var), !bVar3))))) {
          dg::LLVMMemoryRegionSet::const_iterator::operator++(&local_70);
        }
      }
      std::
      _Rb_tree<llvm::Value_*,_std::pair<llvm::Value_*const,_std::vector<dg::LLVMMemoryRegionSet::OffsetPair,_std::allocator<dg::LLVMMemoryRegionSet::OffsetPair>_>_>,_std::_Select1st<std::pair<llvm::Value_*const,_std::vector<dg::LLVMMemoryRegionSet::OffsetPair,_std::allocator<dg::LLVMMemoryRegionSet::OffsetPair>_>_>_>,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_std::vector<dg::LLVMMemoryRegionSet::OffsetPair,_std::allocator<dg::LLVMMemoryRegionSet::OffsetPair>_>_>_>_>
      ::~_Rb_tree(local_58);
      return bVar2;
    }
    if ((I[0x10] == (Instruction)0x3b) || (I[0x10] == (Instruction)0x3c)) {
      CE = (Value *)llvm::Value::stripPointerCasts();
      CVar1 = ((ConstantExpr *)CE)[0x10];
      if (CE == (Value *)0x0 || CVar1 != (ConstantExpr)0x5) {
        if ((CVar1 == (ConstantExpr)0x3) || (CVar1 == (ConstantExpr)0x3a)) {
LAB_0013aea4:
          bVar2 = mayBeTheVar(CE,var);
          if (!bVar2) goto LAB_0013aeb8;
        }
      }
      else {
        CE = constExprVar((ConstantExpr *)CE);
        if (CE != (Value *)0x0) goto LAB_0013aea4;
      }
    }
    bVar2 = true;
  }
  else {
LAB_0013aeb8:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool usesTheVariable(const llvm::Instruction &I, const std::string &var,
                            bool isglobal = false,
                            LLVMPointerAnalysis *pta = nullptr) {
    if (!I.mayReadOrWriteMemory())
        return false;

    if (!pta) {
        // try basic cases that we can decide without PTA
        using namespace llvm;
        const Value *operand = nullptr;
        if (auto *S = dyn_cast<StoreInst>(&I)) {
            auto *A = S->getPointerOperand()->stripPointerCasts();
            if (auto *C = dyn_cast<ConstantExpr>(A)) {
                operand = constExprVar(C);
            } else if ((isa<AllocaInst>(A) || isa<GlobalVariable>(A))) {
                operand = A;
            }
        } else if (auto *L = dyn_cast<LoadInst>(&I)) {
            auto *A = L->getPointerOperand()->stripPointerCasts();
            if (auto *C = dyn_cast<ConstantExpr>(A)) {
                operand = constExprVar(C);
            } else if ((isa<AllocaInst>(A) || isa<GlobalVariable>(A))) {
                operand = A;
            }
        }

        if (operand && !mayBeTheVar(operand, var)) {
            return false;
        }
        return true;
    }

    auto memacc = pta->getAccessedMemory(&I);
    if (memacc.first) {
        // PTA has no information, it may be a definition of the variable,
        // we do not know
        llvm::errs() << "WARNING: matched due to a lack of information: " << I
                     << "\n";
        return true;
    }

    for (const auto &region : memacc.second) {
        if (isglobal &&
            !llvm::isa<llvm::GlobalVariable>(region.pointer.value)) {
            continue;
        }
        if (mayBeTheVar(region.pointer.value, var)) {
            return true;
        }
    }

    return false;
}